

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int acmod_process_raw(acmod_t *acmod,int16 **inout_raw,size_t *inout_n_samps,int full_utt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mfcc_t **ppmVar4;
  long lVar5;
  int16 *__ptr;
  int32 ncep1;
  int32 ncep;
  undefined4 uStack_3c;
  int32 ntail;
  
  if (full_utt == 0) {
    if ((inout_n_samps != (size_t *)0x0) && (*inout_n_samps != 0)) {
      __ptr = *inout_raw;
      iVar2 = acmod->n_mfc_alloc;
      iVar1 = iVar2 - acmod->n_mfc_frame;
      _ncep = (mfcc_t **)CONCAT44(uStack_3c,iVar1);
      iVar3 = acmod->n_mfc_frame + acmod->mfc_outidx;
      while( true ) {
        iVar3 = iVar3 % iVar2;
        if (iVar1 + iVar3 <= iVar2) break;
        ncep1 = iVar2 - iVar3;
        iVar2 = fe_process_frames(acmod->fe,inout_raw,inout_n_samps,acmod->mfc_buf + iVar3,&ncep1);
        if (iVar2 < 0) {
          return -1;
        }
        if ((FILE *)acmod->rawfh != (FILE *)0x0) {
          fwrite(__ptr,2,(long)*inout_raw - (long)__ptr >> 1,(FILE *)acmod->rawfh);
          __ptr = *inout_raw;
          iVar1 = ncep;
        }
        acmod->n_mfc_frame = acmod->n_mfc_frame + ncep1;
        iVar1 = iVar1 - ncep1;
        _ncep = (mfcc_t **)CONCAT44(uStack_3c,iVar1);
        if (ncep1 == 0) goto LAB_00119f93;
        iVar3 = ncep1 + iVar3;
        iVar2 = acmod->n_mfc_alloc;
      }
      iVar2 = fe_process_frames(acmod->fe,inout_raw,inout_n_samps,acmod->mfc_buf + iVar3,&ncep);
      if (iVar2 < 0) {
        return -1;
      }
      if ((FILE *)acmod->rawfh != (FILE *)0x0) {
        fwrite(__ptr,2,(long)*inout_raw - (long)__ptr >> 1,(FILE *)acmod->rawfh);
      }
      acmod->n_mfc_frame = acmod->n_mfc_frame + ncep;
    }
LAB_00119f93:
    iVar2 = acmod_process_mfcbuf(acmod);
  }
  else {
    if ((FILE *)acmod->rawfh != (FILE *)0x0) {
      fwrite(*inout_raw,2,*inout_n_samps,(FILE *)acmod->rawfh);
    }
    iVar1 = fe_process_frames(acmod->fe,(int16 **)0x0,inout_n_samps,(mfcc_t **)0x0,&ncep1);
    iVar2 = -1;
    if (-1 < iVar1) {
      if (acmod->n_mfc_alloc <= ncep1) {
        ckd_free_2d(acmod->mfc_buf);
        lVar5 = (long)ncep1;
        iVar1 = fe_get_output_size(acmod->fe);
        ppmVar4 = (mfcc_t **)
                  __ckd_calloc_2d__(lVar5 + 1,(long)iVar1,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                    ,0x223);
        acmod->mfc_buf = ppmVar4;
        acmod->n_mfc_alloc = ncep1 + 1;
      }
      acmod->n_mfc_frame = 0;
      acmod->mfc_outidx = 0;
      fe_start_utt(acmod->fe);
      iVar1 = fe_process_frames(acmod->fe,inout_raw,inout_n_samps,acmod->mfc_buf,&ncep1);
      if (-1 < iVar1) {
        fe_end_utt(acmod->fe,acmod->mfc_buf[ncep1],&ntail);
        ncep1 = ncep1 + ntail;
        _ncep = acmod->mfc_buf;
        iVar2 = acmod_process_full_cep(acmod,(mfcc_t ***)&ncep,&ncep1);
        acmod->n_mfc_frame = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
acmod_process_raw(acmod_t *acmod,
                  int16 const **inout_raw,
                  size_t *inout_n_samps,
                  int full_utt)
{
    int32 ncep;

    /* If this is a full utterance, process it all at once. */
    if (full_utt)
        return acmod_process_full_raw(acmod, inout_raw, inout_n_samps);

    /* Append MFCCs to the end of any that are previously in there
     * (in practice, there will probably be none) */
    if (inout_n_samps && *inout_n_samps) {
        int16 const *prev_audio_inptr = *inout_raw;
        int inptr;

        /* Total number of frames available. */
        ncep = acmod->n_mfc_alloc - acmod->n_mfc_frame;
        /* Where to start writing them (circular buffer) */
        inptr = (acmod->mfc_outidx + acmod->n_mfc_frame) % acmod->n_mfc_alloc;

        /* Write them in two (or more) parts if there is wraparound. */
        while (inptr + ncep > acmod->n_mfc_alloc) {
            int32 ncep1 = acmod->n_mfc_alloc - inptr;
            if (fe_process_frames(acmod->fe, inout_raw, inout_n_samps,
                                  acmod->mfc_buf + inptr, &ncep1) < 0)
                return -1;
            /* Write to logging file if any. */
            if (acmod->rawfh) {
                fwrite(prev_audio_inptr, 2,
                       *inout_raw - prev_audio_inptr,
                       acmod->rawfh);
                prev_audio_inptr = *inout_raw;
            }
            /* ncep1 now contains the number of frames actually
             * processed.  This is a good thing, but it means we
             * actually still might have some room left at the end of
             * the buffer, hence the while loop.  Unfortunately it
             * also means that in the case where we are really
             * actually done, we need to get out totally, hence the
             * goto. */
            acmod->n_mfc_frame += ncep1;
            ncep -= ncep1;
            inptr += ncep1;
            inptr %= acmod->n_mfc_alloc;
            if (ncep1 == 0)
        	goto alldone;
        }
        assert(inptr + ncep <= acmod->n_mfc_alloc);
        if (fe_process_frames(acmod->fe, inout_raw, inout_n_samps,
                              acmod->mfc_buf + inptr, &ncep) < 0)
            return -1;
        /* Write to logging file if any. */
        if (acmod->rawfh) {
            fwrite(prev_audio_inptr, 2,
                   *inout_raw - prev_audio_inptr, acmod->rawfh);
            prev_audio_inptr = *inout_raw;
        }
        acmod->n_mfc_frame += ncep;
    alldone:
        ;
    }

    /* Hand things off to acmod_process_cep. */
    return acmod_process_mfcbuf(acmod);
}